

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O3

void __thiscall
SPSUnit::insertHrdData
          (SPSUnit *this,int bitPos,int nal_hrd_len,int vcl_hrd_len,bool addVuiHeader,
          HRDParams *params)

{
  uint8_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint8_t *__dest;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  uint uVar6;
  undefined3 in_register_00000081;
  int iVar7;
  int iVar8;
  BitStreamWriter writer;
  BitStreamReader reader;
  BitStreamWriter local_88;
  BitStreamReader local_68;
  HRDParams *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = CONCAT44(in_register_00000014,nal_hrd_len);
  local_38 = CONCAT44(in_register_0000000c,vcl_hrd_len);
  uVar3 = (this->super_NALUnit).m_nalBufferLen;
  local_48 = params;
  __dest = (uint8_t *)operator_new__((ulong)(uVar3 + 0x40));
  iVar7 = bitPos >> 3;
  puVar1 = (this->super_NALUnit).m_nalBuffer;
  memcpy(__dest,puVar1,(ulong)uVar3);
  local_68.super_BitStream.m_totalBits = 0;
  local_68.super_BitStream.m_buffer = (uint *)0x0;
  local_68.super_BitStream.m_initBuffer = (uint *)0x0;
  local_68.m_curVal = 0;
  local_68.m_bitLeft = 0;
  uVar4 = 0;
  BitStream::setBuffer(&local_68.super_BitStream,puVar1 + iVar7,puVar1 + uVar3);
  local_68._24_8_ = local_68._24_8_ & 0xffffffff;
  local_68.m_curVal = BitStreamReader::getCurVal(&local_68,local_68.super_BitStream.m_buffer);
  local_68.m_bitLeft = 0x20;
  local_88.super_BitStream.m_totalBits = 0;
  local_88.super_BitStream.m_buffer = (uint *)0x0;
  local_88.super_BitStream.m_initBuffer = (uint *)0x0;
  local_88.m_curVal = 0;
  local_88.m_bitWrited = 0;
  BitStream::setBuffer
            (&local_88.super_BitStream,__dest + iVar7,
             __dest + (ulong)(this->super_NALUnit).m_nalBufferLen + 0x40);
  local_88.m_curVal = 0;
  local_88.m_bitWrited = 0;
  uVar3 = BitStreamReader::getBits(&local_68,bitPos & 7U);
  BitStreamWriter::putBits(&local_88,bitPos & 7U,uVar3);
  if (CONCAT31(in_register_00000081,addVuiHeader) == 0) {
    BitStreamWriter::putBits(&local_88,1,1);
    bVar2 = BitStreamReader::getBit(&local_68);
    if (bVar2) {
      uVar3 = (uint)local_40;
      uVar4 = uVar3 + 0x1f;
      if (-1 < (int)uVar3) {
        uVar4 = uVar3;
      }
      uVar6 = uVar3 - (uVar4 & 0xffffffe0);
      if (0x1f < (int)uVar3) {
        iVar8 = (int)uVar4 >> 5;
        do {
          uVar3 = BitStreamReader::getBits(&local_68,0x20);
          BitStreamWriter::putBits(&local_88,0x20,uVar3);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      uVar3 = BitStreamReader::getBits(&local_68,uVar6);
      BitStreamWriter::putBits(&local_88,uVar6,uVar3);
    }
    else {
      serializeHRDParameters(&local_88,local_48);
    }
    BitStreamWriter::putBits(&local_88,1,1);
    bVar2 = BitStreamReader::getBit(&local_68);
    if (bVar2) {
      uVar3 = (uint)local_38;
      uVar4 = uVar3 + 0x1f;
      if (-1 < (int)uVar3) {
        uVar4 = uVar3;
      }
      uVar6 = uVar3 - (uVar4 & 0xffffffe0);
      if (0x1f < (int)uVar3) {
        iVar8 = (int)uVar4 >> 5;
        do {
          uVar3 = BitStreamReader::getBits(&local_68,0x20);
          BitStreamWriter::putBits(&local_88,0x20,uVar3);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      uVar3 = BitStreamReader::getBits(&local_68,uVar6);
      BitStreamWriter::putBits(&local_88,uVar6,uVar3);
    }
    else {
      serializeHRDParameters(&local_88,local_48);
    }
    if ((int)local_38 != 0 || (int)local_40 != 0) goto LAB_001c31be;
    uVar4 = this->low_delay_hrd_flag;
  }
  else {
    BitStreamReader::skipBit(&local_68);
    BitStreamWriter::putBits(&local_88,1,1);
    BitStreamWriter::putBits(&local_88,1,0);
    BitStreamWriter::putBits(&local_88,1,0);
    BitStreamWriter::putBits(&local_88,1,0);
    BitStreamWriter::putBits(&local_88,1,0);
    this->timing_info_present_flag = 1;
    this->fixed_frame_rate_flag = 1;
    BitStreamWriter::putBits(&local_88,1,1);
    BitStreamWriter::putBits(&local_88,0x20,this->num_units_in_tick);
    BitStreamWriter::putBits(&local_88,0x20,this->time_scale);
    BitStreamWriter::putBits(&local_88,1,1);
    BitStreamWriter::putBits(&local_88,1,1);
    serializeHRDParameters(&local_88,&this->nalHrdParams);
    BitStreamWriter::putBits(&local_88,1,1);
    serializeHRDParameters(&local_88,&this->nalHrdParams);
    BitStreamWriter::putBits(&local_88,1,this->low_delay_hrd_flag);
    BitStreamWriter::putBits(&local_88,1,0);
  }
  BitStreamWriter::putBits(&local_88,1,uVar4);
LAB_001c31be:
  uVar3 = ((this->full_sps_bit_len - (bitPos & 0xfffffff8U)) + local_68.m_bitLeft +
          ((int)local_68.super_BitStream.m_initBuffer - (int)local_68.super_BitStream.m_buffer) * 8)
          - 0x20;
  if (7 < uVar3) {
    do {
      uVar4 = BitStreamReader::getBits(&local_68,8);
      BitStreamWriter::putBits(&local_88,8,uVar4);
      uVar3 = uVar3 - 8;
    } while (7 < uVar3);
  }
  if (uVar3 != 0) {
    uVar4 = BitStreamReader::getBits(&local_68,uVar3);
    BitStreamWriter::putBits(&local_88,uVar3,uVar4);
  }
  this->full_sps_bit_len =
       (bitPos & 0xfffffff8U) + local_88.m_bitWrited +
       ((int)local_88.super_BitStream.m_buffer - (int)local_88.super_BitStream.m_initBuffer) * 8;
  NALUnit::write_rbsp_trailing_bits(&local_88);
  BitStreamWriter::flushBits(&local_88);
  iVar8 = local_88.m_bitWrited +
          ((int)local_88.super_BitStream.m_buffer - (int)local_88.super_BitStream.m_initBuffer) * 8;
  iVar5 = local_88.m_bitWrited +
          ((int)local_88.super_BitStream.m_buffer - (int)local_88.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar8) {
    iVar5 = iVar8;
  }
  (this->super_NALUnit).m_nalBufferLen = (iVar5 >> 3) + iVar7;
  puVar1 = (this->super_NALUnit).m_nalBuffer;
  if (puVar1 != (uint8_t *)0x0) {
    operator_delete__(puVar1);
  }
  (this->super_NALUnit).m_nalBuffer = __dest;
  return;
}

Assistant:

void SPSUnit::insertHrdData(const int bitPos, const int nal_hrd_len, const int vcl_hrd_len, const bool addVuiHeader,
                            const HRDParams& params)
{
    // replace hrd parameters not implemented. only insert
    static constexpr int EXTRA_SPACE = 64;

    const auto newNalBuffer = new uint8_t[m_nalBufferLen + EXTRA_SPACE];

    const int beforeBytes = bitPos >> 3;
    memcpy(newNalBuffer, m_nalBuffer, m_nalBufferLen);

    BitStreamReader reader{};
    reader.setBuffer(m_nalBuffer + beforeBytes, m_nalBuffer + m_nalBufferLen);
    BitStreamWriter writer{};
    writer.setBuffer(newNalBuffer + beforeBytes, newNalBuffer + m_nalBufferLen + EXTRA_SPACE);
    unsigned tmpVal = reader.getBits(bitPos & 7);
    writer.putBits(bitPos & 7, tmpVal);

    if (addVuiHeader)
    {
        reader.skipBit();  // old vui present header
        writer.putBit(1);  // enable vui parameters
        writer.putBit(0);  // no aspect ratio info
        writer.putBit(0);  // overscan_info_present_flag
        writer.putBit(0);  // video_signal_type_present_flag
        writer.putBit(0);  // chroma_loc_info_present_flag

        timing_info_present_flag = 1;
        fixed_frame_rate_flag = 1;
        writer.putBit(1);  // timing info present flag
        writer.putBits(32, num_units_in_tick);
        writer.putBits(32, time_scale);
        writer.putBit(1);  // fixed framerate flag

        writer.putBit(1);  // enable nal_hrd_params flags here
        serializeHRDParameters(writer, nalHrdParams);

        writer.putBit(1);  // enable vcl_hrd_params flags here
        serializeHRDParameters(writer, nalHrdParams);

        writer.putBit(low_delay_hrd_flag);
        writer.putBit(0);  // pic_struct_present_flag
        writer.putBit(0);  // bitstream_restriction_flag
    }
    else
    {
        writer.putBit(1);  // enable nal_hrd_params flags here
        if (reader.getBit())
        {  // source nal_hrd_parameters_present_flag
            // nal hrd already exists, copy from a source stream
            for (int i = 0; i < nal_hrd_len / 32; ++i) writer.putBits(32, reader.getBits(32));
            writer.putBits(nal_hrd_len % 32, reader.getBits(nal_hrd_len % 32));
        }
        else
        {
            serializeHRDParameters(writer, params);
        }

        writer.putBit(1);  // enable nal_vcl_params flags here
        if (reader.getBit())
        {  // source vcl_hrd_parameters_present_flag
            // vcl hrd already exists, copy from a source stream
            for (int i = 0; i < vcl_hrd_len / 32; ++i) writer.putBits(32, reader.getBits(32));
            writer.putBits(vcl_hrd_len % 32, reader.getBits(vcl_hrd_len % 32));
        }
        else
        {
            serializeHRDParameters(writer, params);
        }

        if (nal_hrd_len == 0 && vcl_hrd_len == 0)
            writer.putBit(low_delay_hrd_flag);  // absent in the source stream, add
    }

    // copy end of SPS
    unsigned bitRest = full_sps_bit_len - reader.getBitsCount() - beforeBytes * 8;
    for (; bitRest >= 8; bitRest -= 8)
    {
        tmpVal = reader.getBits(8);
        writer.putBits(8, tmpVal);
    }
    if (bitRest > 0)
    {
        tmpVal = reader.getBits(bitRest);
        writer.putBits(bitRest, tmpVal);
    }

    full_sps_bit_len = writer.getBitsCount() + beforeBytes * 8;

    write_rbsp_trailing_bits(writer);
    writer.flushBits();
    m_nalBufferLen = writer.getBitsCount() / 8 + beforeBytes;

    delete[] m_nalBuffer;
    m_nalBuffer = newNalBuffer;
}